

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O3

void __thiscall QRingBuffer::append(QRingBuffer *this,QByteArray *qba)

{
  iterator iVar1;
  long lVar2;
  long in_FS_OFFSET;
  QRingChunk local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->bufferSize == 0) && ((this->buffers).d.size != 0)) {
    iVar1 = QList<QRingChunk>::end(&this->buffers);
    QByteArray::operator=(&iVar1.i[-1].chunk,qba);
    iVar1.i[-1].headOffset = 0;
    lVar2 = (qba->d).size;
    iVar1.i[-1].tailOffset = lVar2;
  }
  else {
    local_48.chunk.d.d = (qba->d).d;
    local_48.chunk.d.ptr = (qba->d).ptr;
    local_48.chunk.d.size = (qba->d).size;
    local_48.tailOffset = local_48.chunk.d.size;
    if (&(local_48.chunk.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_48.chunk.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_48.chunk.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_48.tailOffset = (qba->d).size;
    }
    local_48.headOffset = 0;
    QtPrivate::QMovableArrayOps<QRingChunk>::emplace<QRingChunk>
              ((QMovableArrayOps<QRingChunk> *)this,(this->buffers).d.size,&local_48);
    QList<QRingChunk>::end(&this->buffers);
    if (&(local_48.chunk.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_48.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_48.chunk.d.d)->super_QArrayData,1,0x10);
      }
    }
    lVar2 = (qba->d).size;
  }
  this->bufferSize = this->bufferSize + lVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRingBuffer::append(const QByteArray &qba)
{
    if (bufferSize != 0 || buffers.isEmpty())
        buffers.append(QRingChunk(qba));
    else
        buffers.last().assign(qba);
    bufferSize += qba.size();
}